

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::Track::Create
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               Track **pResult)

{
  int iVar1;
  Track *pTVar2;
  long lVar3;
  
  lVar3 = -1;
  if (*pResult == (Track *)0x0) {
    pTVar2 = (Track *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
    if (pTVar2 != (Track *)0x0) {
      pTVar2->_vptr_Track = (_func_int **)&PTR__Track_00123b88;
      pTVar2->m_pSegment = pSegment;
      pTVar2->m_element_start = element_start;
      pTVar2->m_element_size = element_size;
      (pTVar2->m_info).uid = 0;
      (pTVar2->m_info).defaultDuration = 0;
      (pTVar2->m_info).codecDelay = 0;
      (pTVar2->m_info).seekPreRoll = 0;
      (pTVar2->m_info).nameAsUTF8 = (char *)0x0;
      (pTVar2->m_info).language = (char *)0x0;
      (pTVar2->m_info).codecId = (char *)0x0;
      (pTVar2->m_info).codecNameAsUTF8 = (char *)0x0;
      (pTVar2->m_info).codecPrivate = (uchar *)0x0;
      (pTVar2->m_info).codecPrivateSize = 0;
      (pTVar2->m_info).lacing = false;
      (pTVar2->m_eos).super_BlockEntry.m_pCluster = (Cluster *)0x0;
      (pTVar2->m_eos).super_BlockEntry.m_index = -0x8000000000000000;
      (pTVar2->m_eos).super_BlockEntry._vptr_BlockEntry = (_func_int **)&PTR__BlockEntry_00123bb8;
      pTVar2->content_encoding_entries_ = (ContentEncoding **)0x0;
      pTVar2->content_encoding_entries_end_ = (ContentEncoding **)0x0;
      iVar1 = Info::Copy(info,&pTVar2->m_info);
      if (iVar1 == 0) {
        *pResult = pTVar2;
        lVar3 = 0;
      }
      else {
        (*pTVar2->_vptr_Track[1])(pTVar2);
      }
    }
  }
  return lVar3;
}

Assistant:

long Track::Create(Segment* pSegment, const Info& info, long long element_start,
                   long long element_size, Track*& pResult) {
  if (pResult)
    return -1;

  Track* const pTrack =
      new (std::nothrow) Track(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pResult = pTrack;
  return 0;  // success
}